

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O1

void __thiscall
InterpGCTest_Collect_GlobalCycle_Test::TestBody(InterpGCTest_Collect_GlobalCycle_Test *this)

{
  Store *this_00;
  bool bVar1;
  char *pcVar2;
  Ptr g2;
  Ptr g1;
  AssertionResult gtest_ar;
  Index after_new;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  Value local_b8;
  Index local_a8;
  RefPtr<wabt::interp::Global> local_98;
  undefined1 local_80 [16];
  AssertHelper local_70;
  unsigned_long local_68;
  GlobalType local_60;
  GlobalType local_48;
  
  this_00 = &(this->super_InterpGCTest).super_InterpTest.store_;
  local_48.super_ExternType.kind = Global;
  local_48.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_002cfc10;
  local_48.super_ExternType._12_4_ = 0xffffffef;
  local_48.mut = Var;
  local_b8.i64_ = 0;
  wabt::interp::Store::
  Alloc<wabt::interp::Global,wabt::interp::Store&,wabt::interp::GlobalType&,wabt::interp::Value&>
            (&local_98,this_00,this_00,&local_48,&local_b8);
  local_60.super_ExternType.kind = Global;
  local_60.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_002cfc10;
  local_60.super_ExternType._12_4_ = 0xffffffef;
  local_60.mut = Var;
  local_80._0_8_ = ((local_98.obj_)->super_Extern).super_Object.self_.index;
  wabt::interp::Store::
  Alloc<wabt::interp::Global,wabt::interp::Store&,wabt::interp::GlobalType&,wabt::interp::Value&>
            ((RefPtr<wabt::interp::Global> *)&local_b8.v128_,this_00,this_00,&local_60,
             (Value *)local_80);
  wabt::interp::Global::Set(local_98.obj_,this_00,(Ref)*(size_t *)(local_b8.i64_ + 0x38));
  local_68 = ((long)*(pointer *)
                     ((long)&(this->super_InterpGCTest).super_InterpTest.store_.objects_.list_.
                             super__Vector_base<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
                             ._M_impl + 8) -
              (long)(this->super_InterpGCTest).super_InterpTest.store_.objects_.list_.
                    super__Vector_base<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) -
             ((long)*(pointer *)
                     ((long)&(this->super_InterpGCTest).super_InterpTest.store_.objects_.free_.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl + 8) -
              (long)(this->super_InterpGCTest).super_InterpTest.store_.objects_.free_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3);
  local_c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((this->super_InterpGCTest).before_new + 2);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_80,"before_new + 2","after_new",(unsigned_long *)&local_c0,&local_68)
  ;
  if (local_80[0] == '\0') {
    testing::Message::Message((Message *)&local_c0);
    if ((undefined8 *)local_80._8_8_ == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_80._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-interp.cc"
               ,0x245,pcVar2);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_c0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_c0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_c0.ptr_ + 8))();
      }
      local_c0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_80 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_98.obj_ != (Global *)0x0) {
    wabt::interp::Store::DeleteRoot(local_98.store_,local_98.root_index_);
    local_98.obj_ = (Global *)0x0;
    local_98.store_ = (Store *)0x0;
    local_98.root_index_ = 0;
  }
  wabt::interp::Store::Collect(this_00);
  local_c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (((long)*(pointer *)
                ((long)&(this->super_InterpGCTest).super_InterpTest.store_.objects_.list_.
                        super__Vector_base<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
                        ._M_impl + 8) -
         (long)(this->super_InterpGCTest).super_InterpTest.store_.objects_.list_.
               super__Vector_base<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3) -
       ((long)*(pointer *)
               ((long)&(this->super_InterpGCTest).super_InterpTest.store_.objects_.free_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8
               ) -
        (long)(this->super_InterpGCTest).super_InterpTest.store_.objects_.free_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start >> 3));
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_80,"after_new","store_.object_count()",&local_68,
             (unsigned_long *)&local_c0);
  if (local_80[0] == '\0') {
    testing::Message::Message((Message *)&local_c0);
    if ((undefined8 *)local_80._8_8_ == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_80._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-interp.cc"
               ,0x24a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_c0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_c0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_c0.ptr_ + 8))();
      }
      local_c0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_80 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_b8.i64_ != 0) {
    wabt::interp::Store::DeleteRoot((Store *)local_b8._8_8_,local_a8);
    local_b8.i64_ = 0;
    local_b8._8_8_ = (Store *)0x0;
    local_a8 = 0;
  }
  if (local_b8.i64_ != 0) {
    wabt::interp::Store::DeleteRoot((Store *)local_b8._8_8_,local_a8);
    local_b8.i64_ = 0;
    local_b8._8_8_ = (Store *)0x0;
    local_a8 = 0;
  }
  if (local_98.obj_ != (Global *)0x0) {
    wabt::interp::Store::DeleteRoot(local_98.store_,local_98.root_index_);
  }
  return;
}

Assistant:

TEST_F(InterpGCTest, Collect_GlobalCycle) {
  auto gt = GlobalType{ValueType::Anyref, Mutability::Var};
  auto g1 = Global::New(store_, gt, Value::Make(Ref::Null));
  auto g2 = Global::New(store_, gt, Value::Make(g1->self()));
  g1->Set(store_, g2->self());

  auto after_new = store_.object_count();
  EXPECT_EQ(before_new + 2, after_new);

  // Remove g1 root, but it's kept alive by g2.
  g1.reset();
  store_.Collect();
  EXPECT_EQ(after_new, store_.object_count());

  // Remove g2 root, now both should be removed.
  g2.reset();
}